

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmfont.c
# Opt level: O0

int each_character(ALLEGRO_FONT *f,ALLEGRO_COLOR color,ALLEGRO_USTR *text,float x,float y,
                  ALLEGRO_GLYPH *glyph,
                  _func_int_ALLEGRO_FONT_ptr_ALLEGRO_COLOR_int_float_float_ALLEGRO_GLYPH_ptr *cb)

{
  int c_00;
  int iVar1;
  BMFONT_CHAR *prev_00;
  code *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  float in_XMM2_Da;
  undefined4 in_XMM3_Da;
  BMFONT_CHAR *pc;
  int c;
  int prev;
  int advance;
  int pos;
  BMFONT_DATA *data;
  int local_4c;
  int local_48;
  undefined4 local_44;
  BMFONT_DATA *local_40;
  code *local_38;
  undefined8 local_30;
  undefined4 local_28;
  float local_24;
  undefined8 local_20;
  undefined8 *local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_40 = (BMFONT_DATA *)*in_RDI;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  local_38 = in_RCX;
  local_30 = in_RDX;
  local_28 = in_XMM3_Da;
  local_24 = in_XMM2_Da;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_10 = in_XMM0_Qa;
  local_8 = in_XMM1_Qa;
  while( true ) {
    c_00 = al_ustr_get_next(local_20,&local_44);
    if (c_00 < 0) break;
    if (local_4c != 0) {
      prev_00 = find_codepoint(local_40,local_4c);
      iVar1 = get_kerning(prev_00,c_00);
      local_48 = iVar1 + local_48;
    }
    iVar1 = (*local_38)(local_10,local_8,local_24 + (float)local_48,local_28,local_18,c_00,local_30)
    ;
    local_48 = iVar1 + local_48;
    local_4c = c_00;
  }
  return local_48;
}

Assistant:

static int each_character(const ALLEGRO_FONT *f, ALLEGRO_COLOR color,
      const ALLEGRO_USTR *text, float x, float y, ALLEGRO_GLYPH *glyph,
      int (*cb)(const ALLEGRO_FONT *f, ALLEGRO_COLOR color, int ch,
      float x, float y, ALLEGRO_GLYPH *glyph)) {
   BMFONT_DATA *data = f->data;
   int pos = 0;
   int advance = 0;
   int prev = 0;
   while (true) {
      int c = al_ustr_get_next(text, &pos);
      if (c < 0) break;
      if (prev) {
         BMFONT_CHAR *pc = find_codepoint(data, prev);
         advance += get_kerning(pc, c);
      }
      advance += cb(f, color, c, x + advance, y, glyph);
      prev = c;
   }
   return advance;
}